

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ArrayPtr<const_char> kj::_::safeUnixPath(sockaddr_un *addr,uint addrlen)

{
  size_t sVar1;
  ArrayPtr<const_char> AVar2;
  size_t local_58;
  size_t pathlen;
  size_t maxPathlen;
  Fault f_1;
  Fault local_30;
  Fault f;
  uint addrlen_local;
  sockaddr_un *addr_local;
  
  f.exception._4_4_ = addrlen;
  if (addr->sun_family != 1) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x7b9,FAILED,"addr->sun_family == AF_UNIX","\"not a unix address\"",
               (char (*) [19])"not a unix address");
    Debug::Fault::fatal(&local_30);
  }
  if (1 < addrlen) {
    sVar1 = (ulong)addrlen - 2;
    if ((sVar1 == 0) || (addr->sun_path[0] != '\0')) {
      local_58 = strnlen(addr->sun_path,sVar1);
    }
    else {
      sVar1 = strnlen(addr->sun_path + 1,(ulong)addrlen - 3);
      local_58 = sVar1 + 1;
    }
    AVar2 = arrayPtr<char_const>(addr->sun_path,local_58);
    return AVar2;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
            ((Fault *)&maxPathlen,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x7ba,FAILED,"addrlen >= offsetof(sockaddr_un, sun_path)","\"invalid unix address\"",
             (char (*) [21])"invalid unix address");
  Debug::Fault::fatal((Fault *)&maxPathlen);
}

Assistant:

kj::ArrayPtr<const char> safeUnixPath(const struct sockaddr_un* addr, uint addrlen) {
  KJ_REQUIRE(addr->sun_family == AF_UNIX, "not a unix address");
  KJ_REQUIRE(addrlen >= offsetof(sockaddr_un, sun_path), "invalid unix address");

  size_t maxPathlen = addrlen - offsetof(sockaddr_un, sun_path);

  size_t pathlen;
  if (maxPathlen > 0 && addr->sun_path[0] == '\0') {
    // Linux "abstract" unix address
    pathlen = strnlen(addr->sun_path + 1, maxPathlen - 1) + 1;
  } else {
    pathlen = strnlen(addr->sun_path, maxPathlen);
  }
  return kj::arrayPtr(addr->sun_path, pathlen);
}